

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

Var Js::ProfilingHelpers::ProfiledLdElem
              (Var base,Var varIndex,FunctionBody *functionBody,ProfileId profileId,
              bool didArrayAccessHelperCall,bool bailedOutOnArraySpecialization)

{
  code *pcVar1;
  JavascriptArray *pJVar2;
  bool bVar3;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  bool expectingVarArray;
  ObjectType OVar4;
  uint uVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext_00;
  DynamicProfileInfo *pDVar7;
  INT_PTR IVar8;
  INT_PTR IVar9;
  RecyclableObject *recyclableObject;
  bool local_c9;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_ae;
  PropertyCacheOperationInfo local_ab;
  ValueType arrayType;
  Var pvStack_a8;
  PropertyCacheOperationInfo operationInfo;
  Var element;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *cacheOwner;
  ScriptContext *scriptContext;
  uint local_80;
  uint32 offset;
  int32 index;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_74;
  undefined1 local_71;
  SparseArraySegmentBase *pSStack_70;
  bool isVirtual;
  SparseArraySegmentBase *head;
  JavascriptArray *pJStack_60;
  uint32 headSegmentLength;
  JavascriptArray *array;
  TypeId arrayTypeId;
  bool isObjectWithArray;
  Var element_1;
  JavascriptArray *local_40;
  JavascriptArray *array_1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_30;
  FldInfoFlags local_2e;
  byte local_2d;
  bool fastPath;
  bool isJsArray;
  LdElemInfo ldElemInfo;
  bool bailedOutOnArraySpecialization_local;
  bool didArrayAccessHelperCall_local;
  ProfileId profileId_local;
  FunctionBody *functionBody_local;
  Var varIndex_local;
  Var base_local;
  
  fastPath = bailedOutOnArraySpecialization;
  isJsArray = didArrayAccessHelperCall;
  ldElemInfo.arrayType.field_0 = (anon_union_2_4_ea848c7b_for_ValueType_13)profileId;
  unique0x10000810 = functionBody;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x13,"(base)","base");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x14,"(varIndex)","varIndex");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (stack0xffffffffffffffd8 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x15,"(functionBody)","functionBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (ldElemInfo.arrayType.field_0 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x16,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  LdElemInfo::LdElemInfo((LdElemInfo *)((long)&array_1 + 6));
  if ((fastPath & 1U) != 0) {
    local_2d = local_2d & 0xfb | 4;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(base);
  bVar3 = TaggedNumber::Is(base);
  local_c9 = false;
  if (!bVar3) {
    local_c9 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(base);
  }
  array_1._5_1_ = local_c9;
  array_1._4_1_ = local_c9;
  if (local_c9 != false) {
    local_40 = UnsafeVarTo<Js::JavascriptArray>(base);
    element_1._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::FromArray(Array,local_40,TypeIds_Array);
    element_1._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)((long)&element_1 + 4));
    pJVar2 = local_40;
    array_1._6_2_ = element_1._6_2_;
    scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)stack0xffffffffffffffd8);
    _arrayTypeId = ProfiledLdElem_FastPath
                             (pJVar2,varIndex,scriptContext_00,(LdElemInfo *)((long)&array_1 + 6));
    array._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  ValueType::Merge((ValueType *)&local_30.field_0,_arrayTypeId);
    local_30.field_0 = array._6_2_;
    pDVar7 = FunctionBody::GetDynamicProfileInfo(stack0xffffffffffffffd8);
    DynamicProfileInfo::RecordElementLoad
              (pDVar7,stack0xffffffffffffffd8,(ProfileId)ldElemInfo.arrayType.field_0,
               (LdElemInfo *)((long)&array_1 + 6));
    return _arrayTypeId;
  }
  pJStack_60 = Js::JavascriptArray::GetArrayForArrayOrObjectWithArray
                         (base,(bool *)((long)&array + 5),(TypeId *)&array);
  if ((isJsArray & 1U) != 0) {
    local_2d = local_2d & 0xfd | 2;
  }
  if (pJStack_60 == (JavascriptArray *)0x0) {
    bVar3 = Js::TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)((long)&head + 4),(TypeId *)&array);
    if (!bVar3) {
      bVar3 = VarIs<Js::RecyclableObject>(base);
      if (bVar3) {
        recyclableObject = UnsafeVarTo<Js::RecyclableObject>(base);
        offset._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ValueType::FromObject(recyclableObject);
        index._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                      ValueType::ToLikely((ValueType *)((long)&offset + 2));
        array_1._6_2_ = index._0_2_;
      }
      goto LAB_00ff97d0;
    }
    IVar8 = VirtualTableInfoBase::GetVirtualTable(base);
    IVar9 = ValueType::GetVirtualTypedArrayVtable((TypeId)array);
    local_71 = IVar8 == IVar9;
    index._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  ValueType::FromTypeId((TypeId)array,(bool)local_71);
    local_74.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)((long)&index + 2));
    array_1._6_2_ = local_74.field_0;
  }
  else {
    if ((array._5_1_ & 1) == 0) {
      head._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::FromArray(Array,pJStack_60,(TypeId)array);
    }
    else {
      head._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::FromObjectArray(pJStack_60);
    }
    head._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::ToLikely((ValueType *)&head);
    array_1._6_2_ = head._2_2_;
    pSStack_70 = Js::JavascriptArray::GetHead(pJStack_60);
    if (pSStack_70->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x4c,"(head->left == 0)","head->left == 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    head._4_4_ = pSStack_70->length;
  }
  bVar3 = TaggedInt::Is(varIndex);
  if (bVar3) {
    scriptContext._4_4_ = TaggedInt::ToInt32(varIndex);
    local_80 = scriptContext._4_4_;
    if ((((int)scriptContext._4_4_ < 0) || (head._4_4_ <= scriptContext._4_4_)) ||
       ((pJStack_60 != (JavascriptArray *)0x0 &&
        (uVar5 = (*(pJStack_60->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [0x77])(pJStack_60,(ulong)scriptContext._4_4_), (uVar5 & 1) != 0)))) {
      local_2d = local_2d & 0xfd | 2;
    }
  }
  else {
    local_2d = local_2d & 0xfd | 2;
  }
LAB_00ff97d0:
  cacheOwner = (RecyclableObject *)
               FunctionProxy::GetScriptContext((FunctionProxy *)stack0xffffffffffffffd8);
  pvStack_a8 = (Var)0x0;
  bVar3 = Js::JavascriptOperators::GetPropertyRecordUsageCache
                    (varIndex,(ScriptContext *)cacheOwner,(PropertyRecordUsageCache **)&element,
                     (RecyclableObject **)&propertyRecordUsageCache);
  if (bVar3) {
    PropertyCacheOperationInfo::PropertyCacheOperationInfo(&local_ab);
    pvStack_a8 = Js::JavascriptOperators::GetElementIWithCache<true>
                           (base,(RecyclableObject *)propertyRecordUsageCache,
                            (PropertyRecordUsageCache *)element,(ScriptContext *)cacheOwner,
                            &local_ab);
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_ab.cacheType);
    local_2e = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_ab.slotType);
    local_2e = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
  }
  else {
    pvStack_a8 = Js::JavascriptOperators::OP_GetElementI(base,varIndex,(ScriptContext *)cacheOwner);
  }
  local_ae.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       LdElemInfo::GetArrayType((LdElemInfo *)((long)&array_1 + 6));
  bVar3 = ValueType::IsUninitialized((ValueType *)&local_ae.field_0);
  if ((bVar3) && (local_2e == FldInfo_NoInfo)) {
    pDVar7 = FunctionBody::GetDynamicProfileInfo(stack0xffffffffffffffd8);
    DynamicProfileInfo::RecordElementLoadAsProfiled
              (pDVar7,stack0xffffffffffffffd8,(ProfileId)ldElemInfo.arrayType.field_0);
    base_local = pvStack_a8;
  }
  else {
    if ((pJStack_60 != (JavascriptArray *)0x0) &&
       (((bVar3 = ValueType::IsLikelyObject((ValueType *)&local_ae.field_0), bVar3 &&
         (OVar4 = ValueType::GetObjectType((ValueType *)&local_ae.field_0), OVar4 == Array)) &&
        (bVar3 = ValueType::HasIntElements((ValueType *)&local_ae.field_0), pJVar2 = pJStack_60,
        !bVar3)))) {
      bVar3 = ValueType::HasFloatElements((ValueType *)&local_ae.field_0);
      expectingVarArray = ValueType::HasVarElements((ValueType *)&local_ae.field_0);
      Js::JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray
                (pJVar2,bVar3,expectingVarArray);
    }
    local_30.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Merge(&ValueType::Uninitialized,pvStack_a8);
    pDVar7 = FunctionBody::GetDynamicProfileInfo(stack0xffffffffffffffd8);
    DynamicProfileInfo::RecordElementLoad
              (pDVar7,stack0xffffffffffffffd8,(ProfileId)ldElemInfo.arrayType.field_0,
               (LdElemInfo *)((long)&array_1 + 6));
    base_local = pvStack_a8;
  }
  return base_local;
}

Assistant:

Var ProfilingHelpers::ProfiledLdElem(
        const Var base,
        const Var varIndex,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdElem);
        Assert(base);
        Assert(varIndex);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        LdElemInfo ldElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            ldElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        const bool fastPath = isJsArray;
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            ldElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();

            const Var element = ProfiledLdElem_FastPath(array, varIndex, functionBody->GetScriptContext(), &ldElemInfo);

            ldElemInfo.elemType = ldElemInfo.elemType.Merge(element);
            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        Assert(!isJsArray);
        bool isObjectWithArray;
        TypeId arrayTypeId;
        JavascriptArray *const array =
            JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);

        if (didArrayAccessHelperCall)
        {
            ldElemInfo.neededHelperCall = true;
        }

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 headSegmentLength;
            if(array)
            {
                ldElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();

                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                ldElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
            }
            else if(Js::VarIs<Js::RecyclableObject>(base))
            {
                ldElemInfo.arrayType = ValueType::FromObject(Js::UnsafeVarTo<Js::RecyclableObject>(base)).ToLikely();
                break;
            }
            else
            {
                break;
            }

            if(!TaggedInt::Is(varIndex))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            const uint32 offset = index;
            if(index < 0 || offset >= headSegmentLength || (array && array->IsMissingHeadSegmentItem(offset)))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }
        } while(false);

        ScriptContext* scriptContext = functionBody->GetScriptContext();
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        Var element = nullptr;
        if (JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            PropertyCacheOperationInfo operationInfo;
            element = JavascriptOperators::GetElementIWithCache<true /* ReturnOperationInfo */>(base, cacheOwner, propertyRecordUsageCache, scriptContext, &operationInfo);

            ldElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            ldElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(ldElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            element = JavascriptOperators::OP_GetElementI(base, varIndex, scriptContext);
        }

        const ValueType arrayType(ldElemInfo.GetArrayType());
        if(!arrayType.IsUninitialized() || ldElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array && arrayType.IsLikelyObject() && arrayType.GetObjectType() == ObjectType::Array && !arrayType.HasIntElements())
            {
                JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(
                    array,
                    arrayType.HasFloatElements(),
                    arrayType.HasVarElements());
            }

            ldElemInfo.elemType = ValueType::Uninitialized.Merge(element);

            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementLoadAsProfiled(functionBody, profileId);
        return element;
        JIT_HELPER_END(ProfiledLdElem);
    }